

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_socket.c
# Opt level: O2

ssize_t pcp_socket_sendto_impl
                  (int sock,void *buf,size_t len,int flags,sockaddr_in6 *src_addr,
                  sockaddr *dest_addr,socklen_t addrlen)

{
  pcp_errno pVar1;
  ssize_t sVar2;
  iovec local_78;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  msghdr local_38;
  
  local_38.msg_iov = &local_78;
  if (src_addr == (sockaddr_in6 *)0x0) {
    pVar1 = pcp_get_error();
    sVar2 = (ulong)(pVar1 != PCP_ERR_WOULDBLOCK) * 9 + -0xd;
  }
  else {
    local_38.msg_control = &local_68;
    local_38.msg_flags = 0;
    local_38._52_4_ = 0;
    local_38.msg_iovlen = 1;
    local_58 = *(undefined8 *)&(src_addr->sin6_addr).__in6_u;
    uStack_50 = *(undefined8 *)((long)&(src_addr->sin6_addr).__in6_u + 8);
    local_38.msg_controllen = 0x28;
    local_60 = 0x3200000029;
    local_68 = 0x24;
    local_48 = (ulong)src_addr->sin6_scope_id;
    local_38._12_4_ = 0;
    local_38.msg_namelen = addrlen;
    local_78.iov_base = buf;
    local_78.iov_len = len;
    local_38.msg_name = dest_addr;
    sVar2 = sendmsg(sock,&local_38,flags);
  }
  return sVar2;
}

Assistant:

static ssize_t pcp_socket_sendto_impl(PCP_SOCKET sock, const void *buf,
                                      size_t len, int flags UNUSED,
                                      const struct sockaddr_in6 *src_addr,
                                      struct sockaddr *dest_addr,
                                      socklen_t addrlen) {
    ssize_t ret = -1;

#ifndef PCP_SOCKET_IS_VOIDPTR

#if defined(IPV6_PKTINFO)
    if (src_addr) {
        struct in6_pktinfo ipi6 = {0};

#ifndef WIN32
        uint8_t c[CMSG_SPACE(sizeof(struct in6_pktinfo))] = {0};
        struct iovec iov;
        struct msghdr msg;
        struct cmsghdr *cmsg;

        iov.iov_base = (void *)buf;
        iov.iov_len = len;
        memset(&msg, 0, sizeof(msg));
        msg.msg_iov = &iov;
        msg.msg_iovlen = 1;
        ipi6.ipi6_addr = src_addr->sin6_addr;
        ipi6.ipi6_ifindex = src_addr->sin6_scope_id;
        msg.msg_control = c;
        msg.msg_controllen = sizeof(c);
        cmsg = CMSG_FIRSTHDR(&msg);
        cmsg->cmsg_level = IPPROTO_IPV6;
        cmsg->cmsg_type = IPV6_PKTINFO;
        cmsg->cmsg_len = CMSG_LEN(sizeof(ipi6));
        memcpy(CMSG_DATA(cmsg), &ipi6, sizeof(ipi6));
        msg.msg_name = (void *)dest_addr;
        msg.msg_namelen = addrlen;
        ret = sendmsg(sock, &msg, flags);
#else  // WIN32
        WSABUF wsaBuf;
        wsaBuf.buf = buf;
        wsaBuf.len = len;
        uint8_t c[WSA_CMSG_SPACE(sizeof(struct in6_pktinfo))] = {0};

        WSAMSG wsaMsg;
        memset(&wsaMsg, 0, sizeof(wsaMsg));
        wsaMsg.name = (struct sockaddr *)dest_addr;
        wsaMsg.namelen = addrlen;
        wsaMsg.lpBuffers = &wsaBuf;
        wsaMsg.dwBufferCount = 1;
        wsaMsg.Control.buf = c;

        // Set the source address inside the control message
        if (IN6_IS_ADDR_V4MAPPED(&src_addr->sin6_addr)) {
            wsaMsg.Control.len = WSA_CMSG_SPACE(sizeof(struct in_pktinfo));
            struct cmsghdr *cmsg = WSA_CMSG_FIRSTHDR(&wsaMsg);
            cmsg->cmsg_level = IPPROTO_IP;
            cmsg->cmsg_type = IP_PKTINFO;
            cmsg->cmsg_len = WSA_CMSG_LEN(sizeof(struct in_pktinfo));
            struct in_pktinfo *pktinfo =
                (struct in_pktinfo *)WSA_CMSG_DATA(cmsg);
            pktinfo->ipi_addr.s_addr = S6_ADDR32(&src_addr->sin6_addr)[3];
        } else {
            wsaMsg.Control.len = WSA_CMSG_SPACE(sizeof(struct in6_pktinfo));
            struct cmsghdr *cmsg = WSA_CMSG_FIRSTHDR(&wsaMsg);
            cmsg->cmsg_level = IPPROTO_IPV6;
            cmsg->cmsg_type = IPV6_PKTINFO;
            cmsg->cmsg_len = WSA_CMSG_LEN(sizeof(struct in6_pktinfo));
            struct in6_pktinfo *pktinfo =
                (struct in6_pktinfo *)WSA_CMSG_DATA(cmsg);
            IPV6_ADDR_COPY(&pktinfo->ipi6_addr, &src_addr->sin6_addr);
            pktinfo->ipi6_ifindex = src_addr->sin6_scope_id;
        }

        LPFN_WSARECVMSG WSARecvMsg;
        GUID WSARecvMsg_GUID = WSAID_WSARECVMSG;
        DWORD dwBytesReturned;

        if (WSAIoctl(sock, SIO_GET_EXTENSION_FUNCTION_POINTER, &WSARecvMsg_GUID,
                     sizeof(GUID), &WSARecvMsg, sizeof(WSARecvMsg),
                     &dwBytesReturned, NULL, NULL) == SOCKET_ERROR) {
            PCP_LOG(PCP_LOGLVL_PERR, ("WSAIoctl failed"));
            return 1;
        }

        // Send the packet
        DWORD bytesSent = 0;
        if (WSASendMsg(sock, &wsaMsg, 0, &bytesSent, NULL, NULL) ==
            SOCKET_ERROR) {
            PCP_LOG(PCP_LOGLVL_PERR, "WSASendMsg failed: %d",
                    WSAGetLastError());
        } else {
            ret = bytesSent;
        }
#endif // WIN32
    } else
#else  // IPV6_PKTINFO
    ret = sendto(sock, buf, len, 0, dest_addr, addrlen);
#endif /* IPV6_PKTINFO */

        if ((ret == PCP_SOCKET_ERROR) || (ret != (ssize_t)len)) {
            if (pcp_get_error() == PCP_ERR_WOULDBLOCK) {
                ret = PCP_ERR_WOULDBLOCK;
            } else {
                ret = PCP_ERR_SEND_FAILED;
            }
        }
#endif
    return ret;
}